

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O1

CompiledFilter __thiscall Rml::FilterBasic::CompileFilter(FilterBasic *this,Element *element)

{
  RenderManager *name;
  Element *in_RDX;
  unsigned_long extraout_RDX;
  CompiledFilter CVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  allocator_type local_aa;
  key_compare local_a9;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_90;
  Variant local_48;
  
  name = Element::GetRenderManager(in_RDX);
  local_48.type = NONE;
  Variant::Set(&local_48,
               *(float *)&(element->children).
                          super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[6],_Rml::Variant,_true>(&local_90,(char (*) [6])0x2d5209,&local_48);
  init._M_len = 1;
  init._M_array = &local_90;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_a8,init,&local_a9,&local_aa);
  RenderManager::CompileFilter
            ((RenderManager *)this,(String *)name,
             (Dictionary *)&element->super_EnableObserverPtr<Rml::Element>);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_a8.m_container);
  Variant::~Variant(&local_90.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  Variant::~Variant(&local_48);
  CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.resource_handle =
       extraout_RDX;
  CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)this;
  return (CompiledFilter)CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>;
}

Assistant:

CompiledFilter FilterBasic::CompileFilter(Element* element) const
{
	return element->GetRenderManager()->CompileFilter(name, Dictionary{{"value", Variant(value)}});
}